

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool IsCommaDelimitedDoubleArray(wchar_t *wsz,int length,int numDoubles)

{
  int iVar1;
  bool bVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  ON_wString s;
  wchar_t buf [401];
  ON_wString local_680;
  wchar_t local_678 [402];
  
  if (length == 0) {
    bVar2 = false;
  }
  else {
    ON_wString::ON_wString(&local_680,wsz);
    ON_wString::operator+=(&local_680,L",");
    memset(local_678,0,0x644);
    pwVar3 = ON_wString::Array(&local_680);
    iVar6 = 0;
    if (0 < numDoubles) {
      iVar6 = numDoubles;
    }
    iVar1 = 0;
    do {
      iVar7 = iVar1;
      if ((iVar7 == iVar6) || (wVar5 = *pwVar3, wVar5 == L'\0')) break;
      for (uVar4 = 0; (wVar5 != L',' && (uVar4 < 0x640)); uVar4 = uVar4 + 4) {
        *(wchar_t *)((long)local_678 + uVar4) = wVar5;
        wVar5 = *(wchar_t *)((long)pwVar3 + uVar4 + 4);
      }
      *(undefined4 *)((long)local_678 + uVar4) = 0;
      if (399 < (ulong)((long)uVar4 >> 2)) break;
      pwVar3 = (wchar_t *)((long)pwVar3 + uVar4 + 4);
      bVar2 = IsValidRealNumber(local_678,(int)((long)uVar4 >> 2));
      iVar1 = iVar7 + 1;
    } while (bVar2);
    bVar2 = numDoubles <= iVar7;
    ON_wString::~ON_wString(&local_680);
  }
  return bVar2;
}

Assistant:

static bool IsCommaDelimitedDoubleArray(const wchar_t* wsz, int length, int numDoubles)
{
  if (length == 0)
   return false;

  if ((numDoubles < 1) || (numDoubles > 16))
    return false;

  if (1 == numDoubles) // Optimization.
    return ::IsValidRealNumber(wsz, length);

  // Make sure the input buffer ends with a comma; simplifies the following loop.
  ON_wString s(wsz);
  s += L",";

  // Temporary buffer for isolating each 'double' string element.
  constexpr size_t maxChars = 400;
  wchar_t buf[maxChars+1] = { 0 };

  // Use 'p' to scan the input buffer.
  const auto* p = s.Array();

  for (int i = 0; i < numDoubles; i++)
  {
    // 4th January 2024 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-79458
    // If we've reached the end of the input buffer, we've run out of string elements early; fail.
    if (0 == *p)
      return false;

    // Copy the next comma-delimited element to buf. (q - buf) is the length copied so far.
    wchar_t* q = buf;
    while ((*p != L',') && ((q - buf) < maxChars))
      *q++ = *p++;
    *q = 0;
    p++;

    const auto len = q - buf;
    if (len >= maxChars)
      return false;

    // Check that the element in the buffer is a valid real number (double).
    if (!::IsValidRealNumber(buf, int(len)))
      return false;
  }

  return true;
}